

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void LogTextV(ImGuiContext *g,char *fmt,__va_list_tag *args)

{
  ImGuiTextBuffer *this;
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *__ptr;
  
  this = &g->LogBuffer;
  if (g->LogFile != (ImFileHandle)0x0) {
    ImVector<char>::resize(&this->Buf,0);
    ImGuiTextBuffer::appendfv(this,fmt,args);
    pcVar2 = (g->LogBuffer).Buf.Data;
    __ptr = ImGuiTextBuffer::EmptyString;
    if (pcVar2 != (char *)0x0) {
      __ptr = pcVar2;
    }
    iVar1 = (g->LogBuffer).Buf.Size;
    iVar3 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar3 = 0;
    }
    fwrite(__ptr,1,(long)iVar3,(FILE *)g->LogFile);
    return;
  }
  ImGuiTextBuffer::appendfv(this,fmt,args);
  return;
}

Assistant:

static inline void LogTextV(ImGuiContext& g, const char* fmt, va_list args)
{
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
}